

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::substitute(Forth *this)

{
  ForthStack<unsigned_int> *pFVar1;
  char cVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  iterator iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type sVar11;
  ulong uVar12;
  ulong uVar13;
  char cVar14;
  ulong uVar15;
  int iVar16;
  string Word2;
  string Word1;
  string keyUpper;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  uint local_e0;
  uint local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  uint local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Base_ptr local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  ForthStack<unsigned_int> *local_40;
  Forth *local_38;
  
  requireDStackDepth(this,4,"SUBSTITUTE");
  pFVar1 = &this->dStack;
  local_94 = ForthStack<unsigned_int>::getTop(pFVar1);
  ForthStack<unsigned_int>::pop(pFVar1);
  local_dc = ForthStack<unsigned_int>::getTop(pFVar1);
  uVar6 = ForthStack<unsigned_int>::getTop(pFVar1,1);
  local_40 = pFVar1;
  uVar7 = ForthStack<unsigned_int>::getTop(pFVar1,2);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&local_b8,uVar7,(ulong)uVar6);
  sVar5 = local_b8._M_string_length;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  iVar16 = 0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_48 = &this->replacesSubstitute;
  local_50 = &(this->replacesSubstitute)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e0 = 0;
  local_38 = this;
  do {
    _Var4._M_p = local_b8._M_dataplus._M_p;
    uVar12 = (ulong)iVar16;
    if (sVar5 < uVar12 || sVar5 - uVar12 == 0) break;
    uVar15 = 0xffffffffffffffff;
    if (uVar12 <= local_b8._M_string_length && local_b8._M_string_length - uVar12 != 0) {
      pvVar8 = memchr(local_b8._M_dataplus._M_p + uVar12,0x25,local_b8._M_string_length - uVar12);
      uVar15 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)_Var4._M_p;
    }
    if (uVar15 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_100,&local_b8,uVar12,sVar5 - uVar12);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_d8,local_100._M_dataplus._M_p,local_100._M_string_length);
LAB_0010f36e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      bVar3 = true;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_100,&local_b8,uVar12,uVar15 - uVar12);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_d8,local_100._M_dataplus._M_p,local_100._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      _Var4._M_p = local_b8._M_dataplus._M_p;
      iVar16 = (int)uVar15 + 1;
      uVar12 = (ulong)iVar16;
      if (sVar5 < uVar12 || sVar5 - uVar12 == 0) {
        bVar3 = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,"%");
      }
      else {
        uVar13 = 0xffffffffffffffff;
        if (uVar12 <= local_b8._M_string_length && local_b8._M_string_length - uVar12 != 0) {
          pvVar8 = memchr(local_b8._M_dataplus._M_p + uVar12,0x25,local_b8._M_string_length - uVar12
                         );
          uVar13 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)_Var4._M_p;
        }
        if (uVar13 == 0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_d8,"%");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_100,&local_b8,uVar12,sVar5 - uVar12);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_d8,local_100._M_dataplus._M_p,local_100._M_string_length);
          goto LAB_0010f36e;
        }
        if (uVar13 - uVar12 == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_d8,"%");
          iVar16 = (int)uVar15 + 2;
          bVar3 = false;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_100,&local_b8,uVar12,uVar13 - uVar12);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_70,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_90,&local_70);
          if (local_90._M_string_length != 0) {
            sVar11 = 0;
            do {
              cVar2 = local_90._M_dataplus._M_p[sVar11];
              cVar14 = cVar2 + -0x20;
              if (0x19 < (byte)(cVar2 + 0x9fU)) {
                cVar14 = cVar2;
              }
              local_90._M_dataplus._M_p[sVar11] = cVar14;
              sVar11 = sVar11 + 1;
            } while (local_90._M_string_length != sVar11);
          }
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&local_48->_M_t,&local_90);
          if (iVar9._M_node == local_50) {
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_d8,"%");
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (pbVar10,local_70._M_dataplus._M_p,local_70._M_string_length);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (pbVar10,"%");
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_d8,*(char **)(iVar9._M_node + 2),(size_type)iVar9._M_node[2]._M_parent)
            ;
            local_e0 = local_e0 + 1;
          }
          iVar16 = (int)uVar13 + 1;
          bVar3 = false;
        }
      }
    }
  } while (!bVar3);
  pFVar1 = local_40;
  _Var4._M_p = local_d8._M_dataplus._M_p;
  uVar6 = local_dc;
  uVar7 = 0xffffffff;
  if (local_d8._M_string_length <= local_94) {
    uVar12 = local_d8._M_string_length & 0xffffffff;
    if (uVar12 != 0) {
      uVar15 = 0;
      do {
        dataSpaceSet(local_38,uVar6 + (int)uVar15,_Var4._M_p[uVar15]);
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    ForthStack<unsigned_int>::setTop(pFVar1,1,(uint)local_d8._M_string_length);
    ForthStack<unsigned_int>::setTop(pFVar1,2,local_dc);
    uVar7 = local_e0;
  }
  uVar6 = 0xffffffff;
  if (-1 < (int)uVar7) {
    uVar6 = uVar7;
  }
  ForthStack<unsigned_int>::setTop(pFVar1,uVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void substitute(){
			REQUIRE_DSTACK_DEPTH(4, "SUBSTITUTE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); ;
			auto length1 = dStack.getTop(1); ;
			auto caddr1 = CADDR(dStack.getTop(2));; 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{}, key{}, keyUpper{};
			auto result = 0;
			auto processedIt=0;
			auto processEnd=Word1.size();
			// start processing of Word1
			while(processedIt<processEnd){
				//auto nextPercent=std::find(processedIt,processEnd,'%');
				auto nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// copy chars to buffer and exit from loop
					Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					break;	
				}
				// copy chars before percent char
				Word2.append(Word1.substr(processedIt,nextPercent-processedIt));
				processedIt=nextPercent+1;
				if(processedIt>=processEnd) {
					Word2.append("%");
					break;
				} 
				nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// unclosed percent chars - everything copied to the buffer
					 Word2.append("%");
					 Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					 break;
				}
				if(nextPercent==processedIt){
					// two percents replaced by one percent
					Word2.append("%");
					++processedIt;
					continue;
				}
				key=Word1.substr(processedIt,nextPercent-processedIt);
				keyUpper=key;
				for(auto &c : keyUpper) c=toupper_ascii(c);
				auto foundIt=replacesSubstitute.find(keyUpper);
				if(foundIt==replacesSubstitute.end()){
					Word2.append("%").append(key).append("%");
				} else {
				 Word2.append((*foundIt).second);
				 ++result;
				}
				processedIt=nextPercent+1;
			}
			if(Word2.size()> length2) {
				result=-1;
			} else {
				moveIntoDataSpace( caddr2, Word2.c_str(), CELL(Word2.size()));
				dStack.setTop(1, CELL(Word2.size()) );
				dStack.setTop(2, CELL(caddr2) );

			}
			dStack.setTop((result < 0) ? -1 : result ); 
		}